

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

bool ClipperLib::SlopesEqual
               (IntPoint pt1,IntPoint pt2,IntPoint pt3,IntPoint pt4,bool UseFullInt64Range)

{
  bool bVar1;
  Int128 local_78;
  Int128 local_68;
  long local_58;
  long local_50;
  Int128 local_48;
  Int128 local_38;
  
  if (UseFullInt64Range) {
    local_48.lo = pt1.Y - pt2.Y;
    local_48.hi = local_48.lo >> 0x3f;
    local_50 = pt3.X - pt4.X;
    local_58 = local_50 >> 0x3f;
    Int128::operator*(&local_38,&local_48);
    local_78.lo = pt1.X - pt2.X;
    local_78.hi = local_78.lo >> 0x3f;
    Int128::operator*(&local_68,&local_78);
    bVar1 = local_68.lo == local_38.lo && local_38.hi == local_68.hi;
  }
  else {
    bVar1 = (pt3.X - pt4.X) * (pt1.Y - pt2.Y) - (pt3.Y - pt4.Y) * (pt1.X - pt2.X) == 0;
  }
  return bVar1;
}

Assistant:

bool SlopesEqual(const IntPoint pt1, const IntPoint pt2,
  const IntPoint pt3, const IntPoint pt4, bool UseFullInt64Range)
{
  if (UseFullInt64Range)
    return Int128(pt1.Y-pt2.Y) * Int128(pt3.X-pt4.X) ==
      Int128(pt1.X-pt2.X) * Int128(pt3.Y-pt4.Y);
  else return (pt1.Y-pt2.Y)*(pt3.X-pt4.X) == (pt1.X-pt2.X)*(pt3.Y-pt4.Y);
}